

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O3

uint16_t __thiscall AmsRouter::OpenPort(AmsRouter *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  ulong uVar4;
  AmsPort *this_00;
  bool bVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  this_00 = (AmsPort *)&this->ports;
  uVar4 = 0;
  bVar5 = false;
  do {
    bVar1 = AmsPort::IsOpen(this_00);
    if (!bVar1) {
      uVar2 = AmsPort::Open(this_00,(short)uVar4 + 30000);
      if (!bVar5) goto LAB_0012babb;
      break;
    }
    bVar5 = 0x7e < uVar4;
    uVar4 = uVar4 + 1;
    this_00 = this_00 + 1;
  } while (uVar4 != 0x80);
  uVar2 = 0;
LAB_0012babb:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return uVar2;
}

Assistant:

uint16_t AmsRouter::OpenPort()
{
    std::lock_guard<std::recursive_mutex> lock(mutex);

    for (uint16_t i = 0; i < NUM_PORTS_MAX; ++i) {
        if (!ports[i].IsOpen()) {
            return ports[i].Open(PORT_BASE + i);
        }
    }
    return 0;
}